

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iconify.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  GLFWmonitor **ppGVar5;
  undefined8 *puVar6;
  GLFWwindow *pGVar7;
  GLFWmonitor *monitor;
  char *pcVar8;
  char *pcVar9;
  ulong __nmemb;
  long lVar10;
  ulong uVar11;
  int monitor_count;
  int local_3c;
  ulong local_38;
  
  bVar2 = false;
  bVar3 = 0;
  while( true ) {
    do {
      bVar1 = bVar3;
      iVar4 = getopt(argc,argv,"afhn");
      bVar3 = 1;
    } while (iVar4 == 0x61);
    if (iVar4 != 0x66) break;
    bVar2 = true;
    bVar3 = bVar1;
  }
  if (iVar4 != -1) {
    if (iVar4 == 0x68) {
      usage();
LAB_00115daa:
      exit(0);
    }
    usage();
LAB_00115c35:
    exit(1);
  }
  glfwSetErrorCallback(error_callback);
  iVar4 = glfwInit();
  if (iVar4 == 0) goto LAB_00115c35;
  if ((bool)(bVar1 & bVar2)) {
    ppGVar5 = glfwGetMonitors(&local_3c);
    __nmemb = (ulong)local_3c;
    puVar6 = (undefined8 *)calloc(__nmemb,8);
    if ((long)__nmemb < 1) {
      bVar2 = false;
      goto LAB_00115d6f;
    }
    lVar10 = 0;
    do {
      pGVar7 = create_window(ppGVar5[lVar10]);
      puVar6[lVar10] = pGVar7;
      lVar10 = lVar10 + 1;
    } while (lVar10 < local_3c);
  }
  else {
    if (bVar2) {
      monitor = glfwGetPrimaryMonitor();
    }
    else {
      monitor = (GLFWmonitor *)0x0;
    }
    puVar6 = (undefined8 *)calloc(1,8);
    pGVar7 = create_window(monitor);
    *puVar6 = pGVar7;
    __nmemb = 1;
  }
  uVar11 = 0;
  local_38 = __nmemb;
  do {
    glfwSetKeyCallback((GLFWwindow *)puVar6[uVar11],key_callback);
    glfwSetFramebufferSizeCallback((GLFWwindow *)puVar6[uVar11],framebuffer_size_callback);
    glfwSetWindowSizeCallback((GLFWwindow *)puVar6[uVar11],window_size_callback);
    glfwSetWindowFocusCallback((GLFWwindow *)puVar6[uVar11],window_focus_callback);
    glfwSetWindowIconifyCallback((GLFWwindow *)puVar6[uVar11],window_iconify_callback);
    glfwSetWindowMaximizeCallback((GLFWwindow *)puVar6[uVar11],window_maximize_callback);
    glfwSetWindowRefreshCallback((GLFWwindow *)puVar6[uVar11],window_refresh_callback);
    window_refresh_callback((GLFWwindow *)puVar6[uVar11]);
    iVar4 = glfwGetWindowAttrib((GLFWwindow *)puVar6[uVar11],0x20002);
    pcVar9 = "iconified";
    if (iVar4 == 0) {
      pcVar9 = "restored";
    }
    iVar4 = glfwGetWindowAttrib((GLFWwindow *)puVar6[uVar11],0x20001);
    pcVar8 = "focused";
    if (iVar4 == 0) {
      pcVar8 = "defocused";
    }
    printf("Window is %s and %s\n",pcVar9,pcVar8);
    uVar11 = uVar11 + 1;
  } while ((__nmemb & 0xffffffff) != uVar11);
  bVar2 = true;
  __nmemb = local_38;
LAB_00115d6f:
  do {
    glfwWaitEvents();
    if (bVar2) {
      uVar11 = 0;
      do {
        iVar4 = glfwWindowShouldClose((GLFWwindow *)puVar6[uVar11]);
        if (iVar4 != 0) {
          glfwTerminate();
          goto LAB_00115daa;
        }
        uVar11 = uVar11 + 1;
      } while ((__nmemb & 0xffffffff) != uVar11);
    }
    fflush(_stdout);
  } while( true );
}

Assistant:

int main(int argc, char** argv)
{
    int ch, i, window_count;
    int fullscreen = GLFW_FALSE, all_monitors = GLFW_FALSE;
    GLFWwindow** windows;

    while ((ch = getopt(argc, argv, "afhn")) != -1)
    {
        switch (ch)
        {
            case 'a':
                all_monitors = GLFW_TRUE;
                break;

            case 'h':
                usage();
                exit(EXIT_SUCCESS);

            case 'f':
                fullscreen = GLFW_TRUE;
                break;

            default:
                usage();
                exit(EXIT_FAILURE);
        }
    }

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    if (fullscreen && all_monitors)
    {
        int monitor_count;
        GLFWmonitor** monitors = glfwGetMonitors(&monitor_count);

        window_count = monitor_count;
        windows = calloc(window_count, sizeof(GLFWwindow*));

        for (i = 0;  i < monitor_count;  i++)
        {
            windows[i] = create_window(monitors[i]);
            if (!windows[i])
                break;
        }
    }
    else
    {
        GLFWmonitor* monitor = NULL;

        if (fullscreen)
            monitor = glfwGetPrimaryMonitor();

        window_count = 1;
        windows = calloc(window_count, sizeof(GLFWwindow*));
        windows[0] = create_window(monitor);
    }

    for (i = 0;  i < window_count;  i++)
    {
        glfwSetKeyCallback(windows[i], key_callback);
        glfwSetFramebufferSizeCallback(windows[i], framebuffer_size_callback);
        glfwSetWindowSizeCallback(windows[i], window_size_callback);
        glfwSetWindowFocusCallback(windows[i], window_focus_callback);
        glfwSetWindowIconifyCallback(windows[i], window_iconify_callback);
        glfwSetWindowMaximizeCallback(windows[i], window_maximize_callback);
        glfwSetWindowRefreshCallback(windows[i], window_refresh_callback);

        window_refresh_callback(windows[i]);

        printf("Window is %s and %s\n",
            glfwGetWindowAttrib(windows[i], GLFW_ICONIFIED) ? "iconified" : "restored",
            glfwGetWindowAttrib(windows[i], GLFW_FOCUSED) ? "focused" : "defocused");
    }

    for (;;)
    {
        glfwWaitEvents();

        for (i = 0;  i < window_count;  i++)
        {
            if (glfwWindowShouldClose(windows[i]))
                break;
        }

        if (i < window_count)
            break;

        // Workaround for an issue with msvcrt and mintty
        fflush(stdout);
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}